

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int mbedtls_x509_crt_verify_with_profile
              (mbedtls_x509_crt *crt,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
              mbedtls_x509_crt_profile *profile,char *cn,uint32_t *flags,
              _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy)

{
  byte *pbVar1;
  mbedtls_pk_context *pk;
  mbedtls_md_type_t md_alg;
  void *options;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  mbedtls_pk_type_t mVar6;
  int iVar7;
  size_t sVar8;
  mbedtls_x509_crt *pmVar9;
  mbedtls_x509_crt *parent;
  mbedtls_md_info_t *md_info;
  uint32_t *puVar10;
  mbedtls_x509_crl *crl;
  uint uVar11;
  mbedtls_x509_buf *name;
  mbedtls_asn1_named_data *pmVar12;
  bool bVar13;
  uint32_t *local_158;
  size_t local_150;
  size_t local_128;
  uint32_t cur_flags;
  x509_crt_verify_chain_item ver_chain [10];
  
  *flags = 0;
  uVar11 = 0;
  memset(ver_chain,0,0xa0);
  if (profile == (mbedtls_x509_crt_profile *)0x0) {
    iVar7 = -0x2800;
    goto LAB_0011d30f;
  }
  if (cn != (char *)0x0) {
    sVar8 = strlen(cn);
    if ((crt->ext_types & 0x20) == 0) {
      for (pmVar12 = &crt->subject; pmVar12 != (mbedtls_asn1_named_data *)0x0;
          pmVar12 = pmVar12->next) {
        if ((((pmVar12->oid).len == 3) && (iVar5 = bcmp("U\x04\x03",(pmVar12->oid).p,3), iVar5 == 0)
            ) && (iVar5 = x509_crt_check_cn(&pmVar12->val,cn,sVar8), iVar5 == 0)) goto LAB_0011ce88;
      }
    }
    else {
      for (name = &(crt->subject_alt_names).buf; name != (mbedtls_x509_buf *)0x0;
          name = *(mbedtls_x509_buf **)(name + 1)) {
        iVar5 = x509_crt_check_cn(name,cn,sVar8);
        if (iVar5 == 0) goto LAB_0011ce88;
      }
    }
    ver_chain[0].flags = 4;
    uVar11 = 4;
  }
  goto LAB_0011ce90;
LAB_0011ce88:
  uVar11 = 0;
LAB_0011ce90:
  mVar6 = mbedtls_pk_get_type(&crt->pk);
  if ((profile->allowed_pks >> ((byte)((char)mVar6 - 1) & 0x1f) & 1) == 0) {
    uVar11 = uVar11 | 0x8000;
    ver_chain[0].flags = uVar11;
  }
  iVar5 = x509_profile_check_key(profile,&crt->pk);
  if (iVar5 != 0) {
    ver_chain[0].flags = uVar11 | 0x10000;
  }
  local_150 = 0;
  local_158 = &ver_chain[0].flags;
  bVar13 = false;
  local_128 = 0;
LAB_0011cf06:
  puVar10 = &ver_chain[local_150].flags;
  ver_chain[local_150].crt = crt;
  iVar5 = mbedtls_x509_time_is_past(&crt->valid_to);
  if (iVar5 != 0) {
    *(byte *)puVar10 = (byte)*puVar10 | 1;
  }
  iVar5 = mbedtls_x509_time_is_future(&crt->valid_from);
  if (iVar5 != 0) {
    pbVar1 = (byte *)((long)&ver_chain[local_150].flags + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  if (bVar13) {
LAB_0011d2a1:
    while( true ) {
      if (local_150 == 0xffffffffffffffff) {
        if (*flags != 0) {
          return -0x2700;
        }
        return 0;
      }
      cur_flags = *local_158;
      if ((f_vrfy != (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0) &&
         (iVar5 = (*f_vrfy)(p_vrfy,((x509_crt_verify_chain_item *)(local_158 + -2))->crt,
                            (int)local_150,&cur_flags), iVar5 != 0)) break;
      *flags = *flags | cur_flags;
      local_150 = local_150 - 1;
      local_158 = local_158 + -4;
    }
    iVar7 = -0x3000;
    if (iVar5 != -0x2700) {
      iVar7 = iVar5;
    }
    goto LAB_0011d30f;
  }
  if ((profile->allowed_mds >> ((byte)((char)crt->sig_md - MBEDTLS_MD_MD2) & 0x1f) & 1) == 0) {
    pbVar1 = (byte *)((long)&ver_chain[local_150].flags + 1);
    *pbVar1 = *pbVar1 | 0x40;
  }
  if ((profile->allowed_pks >> ((byte)((char)crt->sig_pk - MBEDTLS_PK_RSA) & 0x1f) & 1) == 0) {
    pbVar1 = (byte *)((long)&ver_chain[local_150].flags + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if ((local_150 == 0) &&
     (iVar5 = x509_name_cmp(&crt->issuer,&crt->subject), pmVar9 = trust_ca, iVar5 == 0)) {
    for (; pmVar9 != (mbedtls_x509_crt *)0x0; pmVar9 = pmVar9->next) {
      sVar8 = (crt->raw).len;
      if ((sVar8 == (pmVar9->raw).len) &&
         (iVar5 = bcmp((crt->raw).p,(pmVar9->raw).p,sVar8), iVar5 == 0)) goto LAB_0011d2a1;
    }
  }
  pmVar9 = x509_crt_find_parent_in(crt,trust_ca,1,local_150,local_128);
  if (pmVar9 == (mbedtls_x509_crt *)0x0) {
    parent = x509_crt_find_parent_in(crt,crt->next,0,local_150,local_128);
    if (parent == (mbedtls_x509_crt *)0x0) {
      *(byte *)puVar10 = (byte)*puVar10 | 8;
      goto LAB_0011d2a1;
    }
    if (local_150 != 0) goto LAB_0011d01f;
LAB_0011d09b:
    iVar5 = x509_crt_check_signature(crt,parent);
    if (iVar5 == 0) {
      bVar13 = false;
    }
    else {
      bVar13 = false;
      *(byte *)puVar10 = (byte)*puVar10 | 8;
    }
  }
  else {
    parent = pmVar9;
    if (local_150 != 0) {
LAB_0011d01f:
      iVar5 = x509_name_cmp(&crt->issuer,&crt->subject);
      local_128 = local_128 + (iVar5 == 0);
      bVar13 = pmVar9 == (mbedtls_x509_crt *)0x0;
      pmVar9 = parent;
      if (bVar13) {
        if (local_150 + 1 < 9) goto LAB_0011d09b;
        iVar7 = -0x3000;
LAB_0011d30f:
        *flags = 0xffffffff;
        return iVar7;
      }
    }
    bVar13 = true;
    parent = pmVar9;
  }
  pk = &parent->pk;
  iVar5 = x509_profile_check_key(profile,pk);
  if (iVar5 != 0) {
    pbVar1 = (byte *)((long)&ver_chain[local_150].flags + 2);
    *pbVar1 = *pbVar1 | 1;
  }
  uVar11 = 0;
  crl = ca_crl;
  while (crl != (mbedtls_x509_crl *)0x0) {
    if (((crl->version == 0) || (sVar8 = (crl->issuer_raw).len, sVar8 != (parent->subject_raw).len))
       || (iVar5 = bcmp((crl->issuer_raw).p,(parent->subject_raw).p,sVar8), iVar5 != 0)) {
      crl = crl->next;
    }
    else {
      iVar5 = mbedtls_x509_crt_check_key_usage(parent,2);
      if (iVar5 != 0) {
        uVar11 = uVar11 | 0x10;
        break;
      }
      uVar2 = uVar11 | 0x20000;
      if ((profile->allowed_mds >> (crl->sig_md - MBEDTLS_MD_MD2 & 0x1f) & 1) != 0) {
        uVar2 = uVar11;
      }
      uVar3 = uVar2 | 0x40000;
      if ((profile->allowed_pks >> ((byte)((char)crl->sig_pk - MBEDTLS_PK_RSA) & 0x1f) & 1) != 0) {
        uVar3 = uVar2;
      }
      md_info = mbedtls_md_info_from_type(crl->sig_md);
      iVar5 = mbedtls_md(md_info,(crl->tbs).p,(crl->tbs).len,(uchar *)&cur_flags);
      if (iVar5 != 0) {
        uVar11 = uVar3 | 0x10;
        break;
      }
      iVar5 = x509_profile_check_key(profile,pk);
      uVar11 = uVar3 | 0x10000;
      if (iVar5 == 0) {
        uVar11 = uVar3;
      }
      md_alg = crl->sig_md;
      mVar6 = crl->sig_pk;
      options = crl->sig_opts;
      bVar4 = mbedtls_md_get_size(md_info);
      iVar5 = mbedtls_pk_verify_ext
                        (mVar6,options,pk,md_alg,(uchar *)&cur_flags,(ulong)bVar4,(crl->sig).p,
                         (crl->sig).len);
      if (iVar5 != 0) {
        uVar11 = uVar11 | 0x10;
        break;
      }
      iVar5 = mbedtls_x509_time_is_past(&crl->next_update);
      uVar2 = uVar11 | 0x20;
      if (iVar5 == 0) {
        uVar2 = uVar11;
      }
      iVar5 = mbedtls_x509_time_is_future(&crl->this_update);
      uVar11 = uVar2 | 0x400;
      if (iVar5 == 0) {
        uVar11 = uVar2;
      }
      iVar5 = mbedtls_x509_crt_is_revoked(crt,crl);
      if (iVar5 != 0) {
        uVar11 = uVar11 | 2;
        break;
      }
      crl = crl->next;
    }
  }
  *puVar10 = *puVar10 | uVar11;
  local_158 = local_158 + 4;
  crt = parent;
  local_150 = local_150 + 1;
  goto LAB_0011cf06;
}

Assistant:

int mbedtls_x509_crt_verify_with_profile( mbedtls_x509_crt *crt,
                     mbedtls_x509_crt *trust_ca,
                     mbedtls_x509_crl *ca_crl,
                     const mbedtls_x509_crt_profile *profile,
                     const char *cn, uint32_t *flags,
                     int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *),
                     void *p_vrfy )
{
    int ret;
    mbedtls_pk_type_t pk_type;
    x509_crt_verify_chain_item ver_chain[X509_MAX_VERIFY_CHAIN_SIZE];
    size_t chain_len;
    uint32_t *ee_flags = &ver_chain[0].flags;

    *flags = 0;
    memset( ver_chain, 0, sizeof( ver_chain ) );
    chain_len = 0;

    if( profile == NULL )
    {
        ret = MBEDTLS_ERR_X509_BAD_INPUT_DATA;
        goto exit;
    }

    /* check name if requested */
    if( cn != NULL )
        x509_crt_verify_name( crt, cn, ee_flags );

    /* Check the type and size of the key */
    pk_type = mbedtls_pk_get_type( &crt->pk );

    if( x509_profile_check_pk_alg( profile, pk_type ) != 0 )
        *ee_flags |= MBEDTLS_X509_BADCERT_BAD_PK;

    if( x509_profile_check_key( profile, &crt->pk ) != 0 )
        *ee_flags |= MBEDTLS_X509_BADCERT_BAD_KEY;

    /* Check the chain */
    ret = x509_crt_verify_chain( crt, trust_ca, ca_crl, profile,
                                 ver_chain, &chain_len );
    if( ret != 0 )
        goto exit;

    /* Build final flags, calling callback on the way if any */
    ret = x509_crt_merge_flags_with_cb( flags,
                                        ver_chain, chain_len, f_vrfy, p_vrfy );

exit:
    /* prevent misuse of the vrfy callback - VERIFY_FAILED would be ignored by
     * the SSL module for authmode optional, but non-zero return from the
     * callback means a fatal error so it shouldn't be ignored */
    if( ret == MBEDTLS_ERR_X509_CERT_VERIFY_FAILED )
        ret = MBEDTLS_ERR_X509_FATAL_ERROR;

    if( ret != 0 )
    {
        *flags = (uint32_t) -1;
        return( ret );
    }

    if( *flags != 0 )
        return( MBEDTLS_ERR_X509_CERT_VERIFY_FAILED );

    return( 0 );
}